

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

Result __thiscall
wabt::ReadFile(wabt *this,string_view filename,
              vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  pointer puVar1;
  pointer puVar2;
  undefined8 this_00;
  int iVar3;
  FILE *__stream;
  size_type __new_size;
  size_t sVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  char *__s;
  Enum EVar5;
  string_view s;
  string filename_str;
  stat statbuf;
  undefined1 local_1068 [32];
  string_view local_1048;
  stat local_1038 [28];
  
  this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)filename.size_;
  local_1048.size_ = (size_type)filename.data_;
  local_1048.data_ = (char *)this;
  string_view::to_string_abi_cxx11_((string *)local_1068,&local_1048);
  this_00 = local_1068._0_8_;
  local_1038[0].st_dev = (__dev_t)local_1048.data_;
  local_1038[0].st_ino = local_1048.size_;
  s.size_ = 1;
  s.data_ = "-";
  iVar3 = string_view::compare((string_view *)local_1038,s);
  if (iVar3 == 0) {
    EVar5 = Ok;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_01,0);
    sVar4 = fread(local_1038,1,0x1000,_stdin);
    if (sVar4 != 0) {
      do {
        puVar1 = (this_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        puVar2 = (this_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (this_01,(size_type)(puVar1 + (sVar4 - (long)puVar2)));
        memcpy(puVar1 + ((long)(this_01->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start - (long)puVar2),local_1038,
               sVar4);
        sVar4 = fread(local_1038,1,0x1000,_stdin);
      } while (sVar4 != 0);
    }
    iVar3 = ferror(_stdin);
    if (iVar3 == 0) goto LAB_001435b3;
    ReadFile();
  }
  else {
    iVar3 = stat((char *)this_00,local_1038);
    if (iVar3 < 0) {
      ReadFile((wabt *)this_00);
    }
    else if ((local_1038[0].st_mode._1_1_ & 0x80) == 0) {
      fprintf(_stderr,"%s: not a regular file\n",this_00);
    }
    else {
      __stream = fopen((char *)this_00,"rb");
      if (__stream == (FILE *)0x0) {
        ReadFile((wabt *)this_00);
      }
      else {
        iVar3 = fseek(__stream,0,2);
        if (iVar3 < 0) {
          __s = "fseek to end failed";
        }
        else {
          __new_size = ftell(__stream);
          if ((long)__new_size < 0) {
            __s = "ftell failed";
          }
          else {
            iVar3 = fseek(__stream,0,0);
            if (-1 < iVar3) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_01,__new_size)
              ;
              if (__new_size != 0) {
                sVar4 = fread((this_01->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start,__new_size,1,__stream);
                if (sVar4 != 1) {
                  ReadFile();
                  goto LAB_001435ad;
                }
              }
              fclose(__stream);
              EVar5 = Ok;
              goto LAB_001435b3;
            }
            __s = "fseek to beginning failed";
          }
        }
        perror(__s);
        fclose(__stream);
      }
    }
  }
LAB_001435ad:
  EVar5 = Error;
LAB_001435b3:
  if ((wabt *)local_1068._0_8_ != (wabt *)(local_1068 + 0x10)) {
    operator_delete((void *)local_1068._0_8_);
  }
  return (Result)EVar5;
}

Assistant:

Result ReadFile(string_view filename, std::vector<uint8_t>* out_data) {
  std::string filename_str = filename.to_string();
  const char* filename_cstr = filename_str.c_str();

  if (filename == "-") {
    return ReadStdin(out_data);
  }

  struct stat statbuf;
  if (stat(filename_cstr, &statbuf) < 0) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (!(statbuf.st_mode & S_IFREG)) {
    fprintf(stderr, "%s: not a regular file\n", filename_cstr);
    return Result::Error;
  }

  FILE* infile = fopen(filename_cstr, "rb");
  if (!infile) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_END) < 0) {
    perror("fseek to end failed");
    fclose(infile);
    return Result::Error;
  }

  long size = ftell(infile);
  if (size < 0) {
    perror("ftell failed");
    fclose(infile);
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_SET) < 0) {
    perror("fseek to beginning failed");
    fclose(infile);
    return Result::Error;
  }

  out_data->resize(size);
  if (size != 0 && fread(out_data->data(), size, 1, infile) != 1) {
    fprintf(stderr, "%s: fread failed: %s\n", filename_cstr, strerror(errno));
    fclose(infile);
    return Result::Error;
  }

  fclose(infile);
  return Result::Ok;
}